

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O1

void __thiscall helics::MessageFederate::~MessageFederate(MessageFederate *this)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  Federate *this_00;
  
  p_Var2 = this->_vptr_MessageFederate[-3];
  p_Var1 = (_func_int *)((long)&this->_vptr_MessageFederate + (long)p_Var2);
  this_00 = (Federate *)(p_Var1 + 0x10);
  *(undefined8 *)p_Var1 = 0x526c68;
  this_00->_vptr_Federate = (_func_int **)0x526d30;
  std::
  unique_ptr<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>::
  ~unique_ptr((unique_ptr<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
               *)(p_Var2 + (long)&(this->mfManager)._M_t));
  Federate::~Federate(this_00);
  return;
}

Assistant:

void MessageFederate::loadFederateData()
{
    mfManager = std::make_unique<MessageFederateManager>(coreObject.get(),
                                                         this,
                                                         getID(),
                                                         singleThreadFederate);
    if (!configFile.empty()) {
        MessageFederate::registerMessageInterfaces(configFile);
    }
}